

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O2

RC __thiscall QL_Manager::InsertIntoIndex(QL_Manager *this,char *recbuf,RID *recRID)

{
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar1;
  int extraout_EAX_01;
  long lVar2;
  int unaff_R12D;
  long lVar3;
  bool bVar4;
  IX_IndexHandle ih;
  
  lVar3 = 0x40;
  lVar2 = 0;
  do {
    if (this->relEntries->attrCount <= lVar2) {
      return 0;
    }
    if (*(int *)(this->attrEntries->relName + lVar3) != -1) {
      IX_Manager::DestroyIndex((IX_Manager *)&ih);
      IX_Manager::DestroyIndex(this->ixm);
      iVar1 = extraout_EAX;
      if ((extraout_EAX == 0) &&
         (IX_IndexHandle::DeleteEntry(&ih), iVar1 = extraout_EAX_00, extraout_EAX_00 == 0)) {
        IX_Manager::DestroyIndex(this->ixm);
        bVar4 = extraout_EAX_01 == 0;
        if (!bVar4) {
          unaff_R12D = extraout_EAX_01;
        }
      }
      else {
        bVar4 = false;
        unaff_R12D = iVar1;
      }
      IX_IndexHandle::~IX_IndexHandle(&ih);
      if (!bVar4) {
        return unaff_R12D;
      }
    }
    lVar2 = lVar2 + 1;
    lVar3 = lVar3 + 0x54;
  } while( true );
}

Assistant:

RC QL_Manager::InsertIntoIndex(char *recbuf, RID recRID){
  RC rc = 0;
  for(int i = 0; i < relEntries->attrCount; i++){
    AttrCatEntry aEntry = attrEntries[i];
    if(aEntry.indexNo != -1){
      IX_IndexHandle ih;
      if((rc = ixm.OpenIndex(relEntries->relName, aEntry.indexNo, ih)))
        return (rc);
      if((rc = ih.InsertEntry((void *)(recbuf + aEntry.offset), recRID)))
        return (rc);
      if((rc = ixm.CloseIndex(ih)))
        return (rc);
    }
  }
  return (0);
}